

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.cc
# Opt level: O1

QPDFObjectHandle __thiscall QPDFOutlineObjectHelper::getDest(QPDFOutlineObjectHelper *this)

{
  undefined1 *puVar1;
  element_type *peVar2;
  QPDFObjectHandle *name;
  bool bVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined8 uVar5;
  size_type this_00;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  long in_RSI;
  QPDFObjectHandle QVar11;
  QPDFObjectHandle dest;
  QPDFObjectHandle A;
  QPDFObjectHandle local_148;
  undefined1 local_138 [32];
  string local_118;
  QPDFObjectHandle local_f8;
  undefined1 local_e8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  element_type *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  long *local_70 [2];
  long local_60 [2];
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  
  local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118._M_dataplus._M_p = (pointer)0x0;
  local_118._M_string_length = 0;
  local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(in_RSI + 8);
  local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x10);
  if ((element_type *)
      local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      puVar1 = (undefined1 *)
               ((long)&(((element_type *)
                        local_f8.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->value).
                       super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               + 8);
      *(int *)puVar1 = *(int *)puVar1 + 1;
      UNLOCK();
    }
    else {
      puVar1 = (undefined1 *)
               ((long)&(((element_type *)
                        local_f8.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->value).
                       super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               + 8);
      *(int *)puVar1 = *(int *)puVar1 + 1;
    }
  }
  peVar2 = (element_type *)(local_138 + 0x10);
  local_138._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"/Dest","");
  bVar6 = QPDFObjectHandle::hasKey(&local_f8,(string *)local_138);
  if ((element_type *)local_138._0_8_ != peVar2) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  if ((element_type *)
      local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (bVar6) {
    local_e8._24_8_ = *(undefined8 *)(in_RSI + 8);
    local_e8._32_8_ = *(long *)(in_RSI + 0x10);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._32_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._32_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._32_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._32_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._32_8_)->_M_use_count + 1;
      }
    }
    local_138._0_8_ = peVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"/Dest","");
    QPDFObjectHandle::getKey(&local_f8,(string *)(local_e8 + 0x18));
    _Var4._M_pi = local_f8.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    _Var10._M_pi = local_148.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var4._M_pi;
    if ((element_type *)_Var10._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
    }
    if ((element_type *)
        local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((element_type *)local_138._0_8_ != peVar2) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._32_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._32_8_);
    }
  }
  else {
    local_a0._0_8_ = *(undefined8 *)(in_RSI + 8);
    local_a0._8_8_ = *(QPDFObjGen *)(in_RSI + 0x10);
    if ((QPDFObjGen)local_a0._8_8_ != (QPDFObjGen)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_a0._8_8_ + 8) = *(_Atomic_word *)(local_a0._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_a0._8_8_ + 8) = *(_Atomic_word *)(local_a0._8_8_ + 8) + 1;
      }
    }
    local_138._0_8_ = peVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"/A","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)((long)&local_118 + 0x10),(string *)local_a0);
    uVar5 = local_118.field_2._8_8_;
    local_118._M_dataplus._M_p = (pointer)local_118.field_2._M_allocated_capacity;
    this_00 = local_118._M_string_length;
    local_118.field_2._M_allocated_capacity = 0;
    local_118.field_2._8_8_ = (element_type *)0x0;
    local_118._M_string_length = uVar5;
    if ((element_type *)this_00 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    bVar6 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_118);
    if (bVar6) {
      local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"/S","");
      QPDFObjectHandle::getKey(&local_40,&local_118);
      bVar7 = QPDFObjectHandle::isName(&local_40);
      if (!bVar7) goto LAB_001d17be;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"/S","");
      QPDFObjectHandle::getKey(&local_50,&local_118);
      QPDFObjectHandle::getName_abi_cxx11_((string *)(local_e8 + 0x18),&local_50);
      iVar9 = std::__cxx11::string::compare(local_e8 + 0x18);
      if (iVar9 != 0) {
        bVar7 = true;
        goto LAB_001d17c1;
      }
      local_90._M_allocated_capacity = (size_type)&local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 0x10),"/D","");
      bVar8 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&local_118,(string *)(local_a0 + 0x10));
      bVar7 = true;
      bVar3 = true;
    }
    else {
LAB_001d17be:
      bVar7 = false;
LAB_001d17c1:
      bVar3 = false;
      bVar8 = false;
    }
    if ((bVar3) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_allocated_capacity != &local_80)) {
      operator_delete((void *)local_90._M_allocated_capacity,local_80._M_allocated_capacity + 1);
    }
    if (bVar7) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._24_8_ != &local_c0) {
        operator_delete((void *)local_e8._24_8_,local_c0._M_allocated_capacity + 1);
      }
      if (local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
    }
    if (bVar6) {
      if (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)local_e8) {
        operator_delete(local_f8.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_e8._0_8_ + 1);
      }
    }
    if ((element_type *)local_118.field_2._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118.field_2._8_8_);
    }
    if ((element_type *)local_138._0_8_ != peVar2) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if ((QPDFObjGen)local_a0._8_8_ != (QPDFObjGen)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
    }
    if (bVar8 != false) {
      local_138._0_8_ = peVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"/D","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)((long)&local_118 + 0x10),&local_118);
      uVar5 = local_118.field_2._8_8_;
      local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_118.field_2._M_allocated_capacity;
      _Var10._M_pi = local_148.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_118.field_2._M_allocated_capacity = 0;
      local_118.field_2._8_8_ = (element_type *)0x0;
      local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
      if ((element_type *)_Var10._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
      }
      if ((element_type *)local_118.field_2._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118.field_2._8_8_);
      }
      if ((element_type *)local_138._0_8_ != peVar2) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
    }
  }
  if (local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    QVar11 = QPDFObjectHandle::newNull();
    _Var10._M_pi = QVar11.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    goto LAB_001d1a01;
  }
  bVar6 = QPDFObjectHandle::isName(&local_148);
  if (bVar6) {
LAB_001d194b:
    name = (QPDFObjectHandle *)**(undefined8 **)(in_RSI + 0x28);
    local_b0 = local_148.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a8._M_pi =
         local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((element_type *)
        local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_148.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_148.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    QVar11 = QPDFOutlineDocumentHelper::resolveNamedDest
                       ((QPDFOutlineDocumentHelper *)local_138,name);
    uVar5 = local_138._8_8_;
    local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_138._0_8_;
    _Var4._M_pi = local_148.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    _Var10._M_pi = QVar11.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_138._0_8_ = (element_type *)0x0;
    local_138._8_8_ = (element_type *)0x0;
    local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
    if ((element_type *)_Var4._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
      _Var10._M_pi = extraout_RDX_00;
    }
    if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
      _Var10._M_pi = extraout_RDX_01;
    }
    if ((element_type *)local_a8._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
      _Var10._M_pi = extraout_RDX_02;
    }
  }
  else {
    bVar6 = QPDFObjectHandle::isString(&local_148);
    _Var10._M_pi = extraout_RDX;
    if (bVar6) goto LAB_001d194b;
  }
  _Var4._M_pi = local_148.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)
       local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (this->super_QPDFObjectHelper).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_QPDFObjectHelper).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var4._M_pi;
  local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
LAB_001d1a01:
  if ((element_type *)local_118._M_string_length != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length);
    _Var10._M_pi = extraout_RDX_03;
  }
  if ((element_type *)
      local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var10._M_pi = extraout_RDX_04;
  }
  QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var10._M_pi;
  QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFOutlineObjectHelper::getDest()
{
    QPDFObjectHandle dest;
    QPDFObjectHandle A;
    if (oh().hasKey("/Dest")) {
        QTC::TC("qpdf", "QPDFOutlineObjectHelper direct dest");
        dest = oh().getKey("/Dest");
    } else if (
        (A = oh().getKey("/A")).isDictionary() && A.getKey("/S").isName() &&
        (A.getKey("/S").getName() == "/GoTo") && A.hasKey("/D")) {
        QTC::TC("qpdf", "QPDFOutlineObjectHelper action dest");
        dest = A.getKey("/D");
    }
    if (!dest) {
        return QPDFObjectHandle::newNull();
    }

    if (dest.isName() || dest.isString()) {
        QTC::TC("qpdf", "QPDFOutlineObjectHelper named dest");
        dest = m->dh.resolveNamedDest(dest);
    }

    return dest;
}